

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
* __thiscall
Parser::parse(vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
              *__return_storage_ptr__,Parser *this)

{
  _Head_base<0UL,_LoopStatement_*,_false> local_40;
  Token local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    while( true ) {
      TokenStream::lookahead(&local_38,this->tokenStream);
      if (local_38.type != LeftBracket) break;
      loop((Parser *)&local_40);
      local_38.span.begin = (unsigned_long_long)local_40._M_head_impl;
      local_40._M_head_impl = (LoopStatement *)0x0;
      std::
      vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
      ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
                ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_38);
      std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr
                ((unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_38);
      std::unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_>::~unique_ptr
                ((unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> *)&local_40);
    }
    if (local_38.type == EndOfFile) break;
    single((Parser *)&local_38);
    std::
    vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
    ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
              ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_38);
    std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr
              ((unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Parser::parse() -> std::vector<std::unique_ptr<Statement>> {
    auto statements = std::vector<std::unique_ptr<Statement>>();

    while (true) {
        auto lookaheadType = tokenStream.lookahead().type;

        if (lookaheadType == TokenKind::EndOfFile)
            break;

        if (lookaheadType == TokenKind::LeftBracket)
            statements.push_back(loop());
        else statements.push_back(single());
    }

    return statements;
}